

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int evp_keyex_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  ptls_key_exchange_context_t *__ptr;
  uint8_t *ptr;
  bool bVar1;
  int iVar2;
  EVP_PKEY *to;
  EVP_PKEY_CTX *ctx;
  uchar *key;
  int iVar3;
  
  __ptr = *_ctx;
  if (secret == (ptls_iovec_t *)0x0) {
    iVar3 = 0;
    goto LAB_00106189;
  }
  secret->base = (uint8_t *)0x0;
  if ((__ptr->pubkey).len == peerkey.len) {
    to = EVP_PKEY_new();
    if (to == (EVP_PKEY *)0x0) {
      iVar3 = 0x201;
    }
    else {
      iVar2 = EVP_PKEY_copy_parameters(to,(EVP_PKEY *)__ptr[1].algo);
      iVar3 = 0x203;
      if ((iVar2 < 1) ||
         (iVar2 = EVP_PKEY_set1_encoded_public_key(to,peerkey.base,peerkey.len), iVar2 < 1)) {
        bVar1 = false;
        iVar3 = 0x203;
      }
      else {
        bVar1 = false;
        ctx = EVP_PKEY_CTX_new((EVP_PKEY *)__ptr[1].algo,(ENGINE *)0x0);
        if (ctx != (EVP_PKEY_CTX *)0x0) {
          iVar2 = EVP_PKEY_derive_init(ctx);
          iVar3 = 0x203;
          if ((iVar2 < 1) || (iVar2 = EVP_PKEY_derive_set_peer(ctx,to), iVar2 < 1)) {
            bVar1 = false;
          }
          else {
            iVar2 = EVP_PKEY_derive(ctx,(uchar *)0x0,&secret->len);
            if (0 < iVar2) {
              key = (uchar *)malloc(secret->len);
              secret->base = key;
              if (key != (uchar *)0x0) {
                iVar2 = EVP_PKEY_derive(ctx,key,&secret->len);
                iVar3 = 0x203;
                if (0 < iVar2) {
                  iVar3 = 0;
                }
                bVar1 = 0 < iVar2;
                goto LAB_00106162;
              }
              iVar3 = 0x201;
            }
            bVar1 = false;
          }
LAB_00106162:
          EVP_PKEY_CTX_free(ctx);
        }
      }
      EVP_PKEY_free(to);
      if (bVar1) goto LAB_00106189;
    }
  }
  else {
    iVar3 = 0x33;
  }
  free(secret->base);
LAB_00106189:
  if (release != 0) {
    if ((EVP_PKEY *)__ptr[1].algo != (EVP_PKEY *)0x0) {
      EVP_PKEY_free((EVP_PKEY *)__ptr[1].algo);
    }
    ptr = (__ptr->pubkey).base;
    if (ptr != (uint8_t *)0x0) {
      CRYPTO_free(ptr);
    }
    free(__ptr);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return iVar3;
}

Assistant:

static int evp_keyex_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_evp_keyex_context_t *ctx = (void *)*_ctx;
    EVP_PKEY *evppeer = NULL;
    EVP_PKEY_CTX *evpctx = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    secret->base = NULL;

    if (peerkey.len != ctx->super.pubkey.len) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }

    if ((evppeer = EVP_PKEY_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_copy_parameters(evppeer, ctx->privkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_set1_tls_encodedpoint(evppeer, peerkey.base, peerkey.len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((evpctx = EVP_PKEY_CTX_new(ctx->privkey, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_set_peer(evpctx, evppeer) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, NULL, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, secret->base, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    if (evppeer != NULL)
        EVP_PKEY_free(evppeer);
    if (ret != 0)
        free(secret->base);
    if (release) {
        evp_keyex_free(ctx);
        *_ctx = NULL;
    }
    return ret;
}